

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O1

error_or<int> * __thiscall
pstore::http::send_message<WsServer_Ping_Test::TestBody()::__2,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          opcode op,span<const_unsigned_char,__1L> *span)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  error_code *peVar4;
  uint *puVar5;
  uint uVar6;
  anon_class_8_1_65350a3f sender_00;
  anon_class_8_1_65350a3f sender_01;
  anon_class_8_1_65350a3f sender_02;
  anon_class_8_1_65350a3f sender_03;
  anon_class_8_1_65350a3f sender_04;
  error_or<int> *peVar7;
  unsigned_short v;
  opcode oVar8;
  undefined4 in_register_00000084;
  error_code eVar9;
  unsigned_long nv;
  error_or<int> local_70;
  error_or<int> local_58;
  ulong local_40 [2];
  ulong *local_30;
  
  v = (unsigned_short)op;
  puVar3 = (ulong *)CONCAT44(in_register_00000084,op);
  uVar6 = (io & 0xfU) << 8;
  lVar1 = *(long *)CONCAT44(in_register_00000084,op);
  if (lVar1 < 0x7e) {
    oVar8 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_70,this,sender,uVar6 | (uint)lVar1 & 0x7f | 0x8000,v);
    if (local_70.has_error_ == false) {
      puVar5 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_00.output._4_4_ = 0;
      sender_00.output._0_4_ = *puVar5;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_00,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar8));
    }
    else {
      eVar9 = error_or<int>::get_error(&local_70);
      __return_storage_ptr__->has_error_ = true;
      peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                         (__return_storage_ptr__);
      peVar4->_M_value = eVar9._M_value;
      peVar4->_M_cat = eVar9._M_cat;
    }
    if (local_70.has_error_ == false) {
      peVar7 = &local_70;
      goto LAB_00143e4c;
    }
    peVar7 = &local_70;
    goto LAB_00143e40;
  }
  if (lVar1 < 0x10000) {
    oVar8 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar6 | 0x807e,v);
    if (local_58.has_error_ == false) {
      puVar5 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar2 = *puVar3;
      if (0xffff < uVar2) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      sender_03.output._4_4_ = 0;
      sender_03.output._0_4_ = *puVar5;
      send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
                (&local_70,this,sender_03,(uint)uVar2 & 0xffff,(unsigned_short)oVar8);
    }
    else {
      eVar9 = error_or<int>::get_error(&local_58);
      local_70.has_error_ = true;
      peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
      peVar4->_M_value = eVar9._M_value;
      peVar4->_M_cat = eVar9._M_cat;
    }
    if (local_70.has_error_ != false) goto LAB_00143dda;
    puVar5 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
    sender_04.output._4_4_ = 0;
    sender_04.output._0_4_ = *puVar5;
    send<WsServer_Ping_Test::TestBody()::__2,int>
              (__return_storage_ptr__,this,sender_04,op,
               (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar8));
  }
  else {
    oVar8 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar6 | 0x807f,v);
    if (local_58.has_error_ == false) {
      puVar5 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar2 = *puVar3;
      if ((long)uVar2 < 0) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      sender_01.output._4_4_ = 0;
      sender_01.output._0_4_ = *puVar5;
      local_40[0] = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                    (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                    (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                    (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      local_30 = local_40;
      local_40[1] = 8;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (&local_70,this,sender_01,(int)(local_40 + 1),
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar8));
    }
    else {
      eVar9 = error_or<int>::get_error(&local_58);
      local_70.has_error_ = true;
      peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
      peVar4->_M_value = eVar9._M_value;
      peVar4->_M_cat = eVar9._M_cat;
    }
    if (local_70.has_error_ == false) {
      puVar5 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_02.output._4_4_ = 0;
      sender_02.output._0_4_ = *puVar5;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_02,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar8));
    }
    else {
LAB_00143dda:
      eVar9 = error_or<int>::get_error(&local_70);
      __return_storage_ptr__->has_error_ = true;
      peVar4 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                         (__return_storage_ptr__);
      peVar4->_M_value = eVar9._M_value;
      peVar4->_M_cat = eVar9._M_cat;
    }
  }
  if (local_70.has_error_ == false) {
    error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
  }
  else {
    error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
  }
  if (local_58.has_error_ == false) {
    peVar7 = &local_58;
LAB_00143e4c:
    error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(peVar7);
    return __return_storage_ptr__;
  }
  peVar7 = &local_58;
LAB_00143e40:
  error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(peVar7);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }